

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicornafl.cpp
# Opt level: O0

uc_afl_ret __thiscall UCAFL::_child_fuzz(UCAFL *this,bool afl_exist)

{
  uc_engine *puVar1;
  uc_afl_cb_place_input_t p_Var2;
  uc_afl_cb_validate_crash_t p_Var3;
  uc_afl_ret uVar4;
  uc_err uVar5;
  char *pcVar6;
  size_t sVar7;
  bool bVar8;
  double __x;
  double dVar9;
  uc_err uc_ret;
  AFL_TESTCASE local_20;
  AFL_TESTCASE testcase;
  uint32_t i;
  bool input_accepted;
  bool first_round;
  bool crash_found;
  bool afl_exist_local;
  UCAFL *this_local;
  
  testcase.ucafl_._6_1_ = 0;
  testcase.ucafl_._5_1_ = 1;
  testcase.ucafl_._0_4_ = 0;
  testcase.ucafl_._7_1_ = afl_exist;
  do {
    bVar8 = true;
    if (this->persistent_iters_ != 0) {
      bVar8 = (uint)testcase.ucafl_ < this->persistent_iters_;
    }
    if (!bVar8) {
      if ((testcase.ucafl_._7_1_ & 1) != 0) {
        exit(0);
      }
      return UC_AFL_RET_NO_AFL;
    }
    if ((testcase.ucafl_._5_1_ & 1) == 0) {
      uVar4 = _afl_next(this,(bool)(testcase.ucafl_._6_1_ & 1));
      if (uVar4 != UC_AFL_RET_OK) {
        exit(1);
      }
      testcase.ucafl_._6_1_ = 0;
    }
    else {
      testcase.ucafl_._5_1_ = 0;
    }
    AFL_TESTCASE::AFL_TESTCASE(&local_20,this);
    puVar1 = this->uc_;
    p_Var2 = this->place_input_callback_;
    pcVar6 = AFL_TESTCASE::ptr(&local_20);
    sVar7 = AFL_TESTCASE::len(&local_20);
    testcase.ucafl_._4_1_ = (*p_Var2)(puVar1,pcVar6,sVar7,(uint)testcase.ucafl_,this->data_);
    if (((testcase.ucafl_._4_1_ ^ 0xff) & 1) == 0) {
      uVar5 = (*this->fuzz_callback_)(this->uc_,this->data_);
      dVar9 = (double)uc_strerror();
      log(dVar9);
      if ((uVar5 != UC_ERR_OK) ||
         (((this->always_validate_ & 1U) != 0 &&
          (this->validate_crash_callback_ != (uc_afl_cb_validate_crash_t)0x0)))) {
        if (this->validate_crash_callback_ != (uc_afl_cb_validate_crash_t)0x0) {
          puVar1 = this->uc_;
          p_Var3 = this->validate_crash_callback_;
          pcVar6 = AFL_TESTCASE::ptr(&local_20);
          sVar7 = AFL_TESTCASE::len(&local_20);
          bVar8 = (*p_Var3)(puVar1,uVar5,pcVar6,(int)sVar7,(uint)testcase.ucafl_,this->data_);
          if (!bVar8) goto LAB_00106f25;
        }
        if (this->persistent_iters_ == 1) {
          dVar9 = (double)uc_strerror(uVar5);
          log(dVar9);
          fflush(_stderr);
          abort();
        }
        testcase.ucafl_._6_1_ = 1;
      }
    }
    else {
      log(__x);
    }
LAB_00106f25:
    AFL_TESTCASE::~AFL_TESTCASE(&local_20);
    testcase.ucafl_._0_4_ = (uint)testcase.ucafl_ + 1;
  } while( true );
}

Assistant:

uc_afl_ret _child_fuzz(bool afl_exist) {
        bool crash_found = false;
        bool first_round = true;
        bool input_accepted;
        uint32_t i = 0;

        for (i = 0; this->persistent_iters_ == 0 || i < this->persistent_iters_;
             i++) {
            if (unlikely(first_round)) {
                first_round = false;
            } else {
                if (this->_afl_next(crash_found) != UC_AFL_RET_OK) {
                    exit(1);
                }

                crash_found = false;
            }

            AFL_TESTCASE testcase(this);

            input_accepted = this->place_input_callback_(
                this->uc_, testcase.ptr(), testcase.len(), i, this->data_);

            if (unlikely(!input_accepted)) {
                ERR_CHILD("Input is not accepted.\n");
                continue;
            }

            uc_err uc_ret = this->fuzz_callback_(this->uc_, this->data_);

            ERR_CHILD("We are stopping for uc_err=%d (%s)\n", uc_ret,
                      uc_strerror(uc_ret));

            if (unlikely(uc_ret != UC_ERR_OK) ||
                (this->always_validate_ && this->validate_crash_callback_)) {

                if (this->validate_crash_callback_ &&
                    !this->validate_crash_callback_(
                        this->uc_, uc_ret, testcase.ptr(), testcase.len(), i,
                        this->data_)) {
                    continue;
                }

                if (this->persistent_iters_ != 1) {
                    crash_found = true;
                    continue;
                }

                ERR_CHILD("UC returned Error: '%s' - let's abort().\n",
                          uc_strerror(uc_ret));
                fflush(stderr);

                abort();
            }
        }

        // We are still in the child, nothing good will come after this.
        // Exit and let the next generation run.
        if (likely(afl_exist)) {
            exit(0);
        }

        // Just run once.
        return UC_AFL_RET_NO_AFL;
    }